

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O1

byte * __thiscall
ChakraCoreStreamWriter::ExtendBuffer
          (ChakraCoreStreamWriter *this,byte *oldBuffer,size_t newSize,size_t *allocatedSize)

{
  byte *pbVar1;
  
  pbVar1 = (*this->reallocateBufferMemory)(this->callbackState,oldBuffer,newSize,allocatedSize);
  this->m_data = pbVar1;
  this->m_length = newSize;
  if (pbVar1 == (byte *)0x0) {
    OutOfMemory_unrecoverable_error();
  }
  return this->m_data;
}

Assistant:

byte * ChakraCoreStreamWriter::ExtendBuffer(byte *oldBuffer, size_t newSize, size_t *allocatedSize)
{
    m_data = this->reallocateBufferMemory(this->callbackState, oldBuffer, newSize, allocatedSize);
    m_length = newSize;

    if (m_data == nullptr)
    {
        // free(m_data);
        OutOfMemory_unrecoverable_error();
    }
    return m_data;
}